

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# publisher.cc
# Opt level: O0

void __thiscall Publisher::setSendBuffer(Publisher *this,int size)

{
  ostream *poVar1;
  char *pcVar2;
  runtime_error *this_00;
  size_t in_RDI;
  stringstream ss;
  int rv;
  int in_stack_fffffffffffffe20;
  undefined7 in_stack_fffffffffffffe30;
  undefined1 in_stack_fffffffffffffe37;
  int in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe3c;
  int in_stack_fffffffffffffe40;
  stringstream local_198 [16];
  ostream local_188 [376];
  int local_10;
  
  local_10 = nn_setsockopt(in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c,
                           in_stack_fffffffffffffe38,
                           (void *)CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30),
                           in_RDI);
  if (local_10 < 0) {
    nn_close(in_stack_fffffffffffffe20);
    std::__cxx11::stringstream::stringstream(local_198);
    poVar1 = std::operator<<(local_188,"nn_setsockopt: ");
    nn_errno();
    pcVar2 = nn_strerror(0);
    std::operator<<(poVar1,pcVar2);
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringstream::str();
    std::runtime_error::runtime_error(this_00,(string *)&stack0xfffffffffffffe38);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void Publisher::setSendBuffer(int size) {
  int rv = nn_setsockopt(fd_, NN_SOL_SOCKET, NN_SNDBUF, &size, sizeof(size));
  if (rv < 0) {
    nn_close(fd_);
    std::stringstream ss;
    ss << "nn_setsockopt: " << nn_strerror(nn_errno());
    throw std::runtime_error(ss.str());
  }
}